

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

void diy::Serialization<std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  size_type __new_size;
  size_t s;
  size_type local_a8;
  Bounds<int> local_a0;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&local_a8,8);
  __new_size = local_a8;
  Bounds<int>::Bounds(&local_a0,0);
  std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::resize(v,__new_size,&local_a0);
  local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_a0.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end =
       local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  if (local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_dynamic_data !=
      (pointer)0x0) {
    operator_delete(local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_data,
                    local_a0.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
                    m_dynamic_capacity << 2);
  }
  if (local_a8 != 0) {
    load<diy::Bounds<int>>
              (bb,(v->super__Vector_base<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start,local_a8);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }